

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

void age_death(CHAR_DATA *ch)

{
  OBJ_DATA *pOVar1;
  OBJ_DATA *obj;
  bool bVar2;
  ROOM_INDEX_DATA *pRVar3;
  
  bVar2 = is_npc(ch);
  if ((!bVar2) && (pRVar3 = get_room_index(0), pRVar3 != (ROOM_INDEX_DATA *)0x0)) {
    pRVar3 = get_room_index(0);
    if (pRVar3 == (ROOM_INDEX_DATA *)0x0) {
      pRVar3 = get_room_index(0);
    }
    obj = ch->carrying;
    while (obj != (OBJ_DATA *)0x0) {
      pOVar1 = obj->next_content;
      extract_obj(obj);
      obj = pOVar1;
    }
    stop_fighting(ch,true);
    make_corpse(ch,ch);
    char_from_room(ch);
    char_to_room(ch,pRVar3);
    do_look(ch,"auto");
    send_to_char("You have died and become a permanent ghost, awaiting your final departure.\n\r",ch
                );
    return;
  }
  return;
}

Assistant:

void age_death(CHAR_DATA *ch)
{
	ROOM_INDEX_DATA *pRoomIndex;
	OBJ_DATA *obj;
	OBJ_DATA *obj_next;

	if (is_npc(ch))
		return;

	pRoomIndex = get_room_index(1212);

	if (pRoomIndex == nullptr)
		return;

	/* For now default to the players recall, or midgaard */
	pRoomIndex = get_room_index(hometown_table[ch->hometown].recall);

	if (pRoomIndex == nullptr)
		pRoomIndex = get_room_index(ROOM_VNUM_TEMPLE);

	for (obj = ch->carrying; obj != nullptr; obj = obj_next)
	{
		obj_next = obj->next_content;
		extract_obj(obj);
	}

	/* All items are poofed at age death */
	stop_fighting(ch, true);
	make_corpse(ch, ch);
	char_from_room(ch);
	char_to_room(ch, pRoomIndex);
	do_look(ch, "auto");

	send_to_char("You have died and become a permanent ghost, awaiting your final departure.\n\r", ch);
}